

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

Reflection * google::protobuf::internal::GetReflectionOrDie(Message *m)

{
  LogMessage *pLVar1;
  DescriptorStringView psVar2;
  bool bVar3;
  allocator<char> local_69;
  string local_68 [48];
  LogMessageFatal local_38 [23];
  Voidify local_21;
  Descriptor *local_20;
  Descriptor *d;
  Reflection *r;
  Message *m_local;
  
  r = (Reflection *)m;
  d = (Descriptor *)Message::GetReflection(m);
  if (d != (Descriptor *)0x0) {
    return (Reflection *)d;
  }
  local_20 = Message::GetDescriptor((Message *)r);
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/reflection_ops.cc"
             ,0x25);
  pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
  pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     (pLVar1,(char (*) [43])"Message does not support reflection (type ");
  bVar3 = local_20 == (Descriptor *)0x0;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_68,"unknown",&local_69);
  }
  else {
    psVar2 = Descriptor::name_abi_cxx11_(local_20);
    std::__cxx11::string::string(local_68,(string *)psVar2);
  }
  pLVar1 = (LogMessage *)absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar1,local_68);
  pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar1,(char (*) [3])0x5ec404);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar1);
  std::__cxx11::string::~string(local_68);
  if (bVar3) {
    std::allocator<char>::~allocator(&local_69);
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
}

Assistant:

static const Reflection* GetReflectionOrDie(const Message& m) {
  const Reflection* r = m.GetReflection();
  if (r == nullptr) {
    const Descriptor* d = m.GetDescriptor();
    // RawMessage is one known type for which GetReflection() returns nullptr.
    ABSL_LOG(FATAL) << "Message does not support reflection (type "
                    << (d ? d->name() : "unknown") << ").";
  }
  return r;
}